

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int define_kf_interval(AV1_COMP *cpi,FIRSTPASS_INFO *firstpass_info,
                      int num_frames_to_detect_scenecut,int search_start_idx)

{
  int iVar1;
  int min_gf_interval;
  int iVar2;
  FIRSTPASS_STATS *frame_stats;
  int in_ECX;
  int in_EDX;
  FIRSTPASS_INFO *in_RSI;
  long *in_RDI;
  double dVar3;
  int unaff_retaddr;
  int unaff_retaddr_00;
  FIRSTPASS_INFO *in_stack_00000008;
  FIRSTPASS_STATS *next_stats;
  double loop_decay_rate;
  int future_stats_count;
  int num_mbs;
  int num_frames_to_next_key;
  int scenecut_detected;
  int frames_since_key;
  int frames_to_key;
  int j;
  int i;
  double decay_accumulator;
  double recent_loop_decay [8];
  KeyFrameCfg *kf_cfg;
  AV1EncoderConfig *oxcf;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  TWO_PASS *twopass;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  int iVar4;
  int in_stack_ffffffffffffff3c;
  int next_stats_index;
  int iVar5;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  double adStack_88 [8];
  int *local_48;
  long *local_40;
  long local_38;
  long *local_30;
  long local_28;
  int local_1c;
  FIRSTPASS_INFO *local_18;
  int in_stack_fffffffffffffff8;
  aom_rc_mode in_stack_fffffffffffffffc;
  
  local_28 = *in_RDI + 0x5bc0;
  local_30 = in_RDI + 0xc0ee;
  local_38 = *in_RDI + 0x8b30;
  local_40 = in_RDI + 0x8464;
  local_48 = (int *)((long)in_RDI + 0x4236c);
  local_a0 = (int)in_RDI[0xc0f4];
  iVar5 = 0;
  local_1c = in_EDX;
  local_18 = in_RSI;
  iVar1 = detect_app_forced_key
                    ((AV1_COMP *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  if (local_1c == 0) {
    local_9c = iVar1;
    if (iVar1 == -1) {
      local_9c = *(int *)((long)local_30 + 0x2c);
    }
  }
  else {
    iVar4 = local_1c;
    if ((iVar1 != -1) && (in_stack_ffffffffffffff3c = iVar1, iVar4 = iVar1, local_1c < iVar1)) {
      in_stack_ffffffffffffff3c = local_1c;
      iVar4 = local_1c;
    }
    local_1c = iVar4;
    for (local_98 = 0; local_98 < 8; local_98 = local_98 + 1) {
      adStack_88[local_98] = 1.0;
    }
    local_94 = 0;
    if ((char)local_40[0x1d] == '\0') {
      iVar4 = (int)in_RDI[0x7832];
    }
    else {
      iVar4 = *(int *)((long)in_RDI + 0x712fc);
    }
    next_stats_index = iVar4;
    min_gf_interval = av1_firstpass_info_future_count(local_18,0);
    for (local_9c = in_ECX; local_a0 = local_a0 + 1, iVar2 = local_9c,
        local_9c < min_gf_interval && local_9c < local_1c; local_9c = local_9c + 1) {
      if (((0 < *(int *)(*in_RDI + 0xaca0)) && ((*(byte *)(local_48 + 5) & 1) != 0)) &&
         (local_9c + 1 < min_gf_interval)) {
        if ((*local_48 <= local_a0) &&
           (iVar5 = test_candidate_kf(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                                      in_stack_fffffffffffffffc,in_stack_fffffffffffffff8,
                                      (int)((ulong)in_RDI >> 0x20)), iVar5 != 0)) break;
        frame_stats = av1_firstpass_info_peek(local_18,local_9c + 1);
        dVar3 = get_prediction_decay_rate(frame_stats);
        adStack_88[local_94 % 8] = dVar3;
        for (local_98 = 0; local_98 < 8; local_98 = local_98 + 1) {
        }
        if ((*local_48 <= local_a0) &&
           (iVar5 = detect_transition_to_still
                              ((FIRSTPASS_INFO *)CONCAT44(iVar5,iVar1),next_stats_index,
                               min_gf_interval,(int)((ulong)dVar3 >> 0x20),SUB84(dVar3,0),
                               (double)frame_stats,(double)CONCAT44(in_stack_ffffffffffffff3c,iVar4)
                              ), iVar5 != 0)) {
          *(undefined4 *)(local_38 + 0x2174) = 0;
          break;
        }
        iVar2 = local_9c + 1;
        if (SBORROW4(iVar2,local_48[1] * 2) == iVar2 + local_48[1] * -2 < 0) break;
      }
      local_94 = local_94 + 1;
    }
    local_9c = iVar2;
    if ((*(int *)(*in_RDI + 0x5a88) != 0) && (iVar5 == 0)) {
      local_9c = iVar1;
    }
  }
  return local_9c;
}

Assistant:

static int define_kf_interval(AV1_COMP *cpi,
                              const FIRSTPASS_INFO *firstpass_info,
                              int num_frames_to_detect_scenecut,
                              int search_start_idx) {
  const TWO_PASS *const twopass = &cpi->ppi->twopass;
  const RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const KeyFrameCfg *const kf_cfg = &oxcf->kf_cfg;
  double recent_loop_decay[FRAMES_TO_CHECK_DECAY];
  double decay_accumulator = 1.0;
  int i = 0, j;
  int frames_to_key = search_start_idx;
  int frames_since_key = rc->frames_since_key + 1;
  int scenecut_detected = 0;

  int num_frames_to_next_key = detect_app_forced_key(cpi);

  if (num_frames_to_detect_scenecut == 0) {
    if (num_frames_to_next_key != -1)
      return num_frames_to_next_key;
    else
      return rc->frames_to_key;
  }

  if (num_frames_to_next_key != -1)
    num_frames_to_detect_scenecut =
        AOMMIN(num_frames_to_detect_scenecut, num_frames_to_next_key);

  // Initialize the decay rates for the recent frames to check
  for (j = 0; j < FRAMES_TO_CHECK_DECAY; ++j) recent_loop_decay[j] = 1.0;

  i = 0;
  const int num_mbs = (oxcf->resize_cfg.resize_mode != RESIZE_NONE)
                          ? cpi->initial_mbs
                          : cpi->common.mi_params.MBs;
  const int future_stats_count =
      av1_firstpass_info_future_count(firstpass_info, 0);
  while (frames_to_key < future_stats_count &&
         frames_to_key < num_frames_to_detect_scenecut) {
    // Provided that we are not at the end of the file...
    if ((cpi->ppi->p_rc.enable_scenecut_detection > 0) && kf_cfg->auto_key &&
        frames_to_key + 1 < future_stats_count) {
      double loop_decay_rate;

      // Check for a scene cut.
      if (frames_since_key >= kf_cfg->key_freq_min) {
        scenecut_detected = test_candidate_kf(
            &twopass->firstpass_info, frames_to_key, frames_since_key,
            oxcf->rc_cfg.mode, cpi->ppi->p_rc.enable_scenecut_detection,
            num_mbs);
        if (scenecut_detected) {
          break;
        }
      }

      // How fast is the prediction quality decaying?
      const FIRSTPASS_STATS *next_stats =
          av1_firstpass_info_peek(firstpass_info, frames_to_key + 1);
      loop_decay_rate = get_prediction_decay_rate(next_stats);

      // We want to know something about the recent past... rather than
      // as used elsewhere where we are concerned with decay in prediction
      // quality since the last GF or KF.
      recent_loop_decay[i % FRAMES_TO_CHECK_DECAY] = loop_decay_rate;
      decay_accumulator = 1.0;
      for (j = 0; j < FRAMES_TO_CHECK_DECAY; ++j)
        decay_accumulator *= recent_loop_decay[j];

      // Special check for transition or high motion followed by a
      // static scene.
      if (frames_since_key >= kf_cfg->key_freq_min) {
        scenecut_detected = detect_transition_to_still(
            firstpass_info, frames_to_key + 1, rc->min_gf_interval, i,
            kf_cfg->key_freq_max - i, loop_decay_rate, decay_accumulator);
        if (scenecut_detected) {
          // In the case of transition followed by a static scene, the key frame
          // could be a good predictor for the following frames, therefore we
          // do not use an arf.
          p_rc->use_arf_in_this_kf_group = 0;
          break;
        }
      }

      // Step on to the next frame.
      ++frames_to_key;
      ++frames_since_key;

      // If we don't have a real key frame within the next two
      // key_freq_max intervals then break out of the loop.
      if (frames_to_key >= 2 * kf_cfg->key_freq_max) {
        break;
      }
    } else {
      ++frames_to_key;
      ++frames_since_key;
    }
    ++i;
  }
  if (cpi->ppi->lap_enabled && !scenecut_detected)
    frames_to_key = num_frames_to_next_key;

  return frames_to_key;
}